

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::setupEdgesInterpolation
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  qreal minPref;
  QGraphicsLayoutItem *this_00;
  qreal *pqVar1;
  long lVar2;
  long in_FS_OFFSET;
  pair<QGraphicsAnchorLayoutPrivate::Interval,_double> pVar3;
  QRectF local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  if (orientation == Horizontal) {
    QGraphicsLayoutItem::contentsRect(&local_40,this_00);
    pqVar1 = &local_40.w;
  }
  else {
    QGraphicsLayoutItem::contentsRect(&local_40,this_00);
    pqVar1 = &local_40.h;
  }
  lVar2 = (long)(int)orientation;
  minPref = *(qreal *)((long)&this->spacings + lVar2 * 0x18);
  pVar3 = getFactor(*pqVar1,*(qreal *)((long)&this->spacings + lVar2 * 0x18 + -8),minPref,minPref,
                    minPref,(this->sizeHints).m_data[lVar2 + -1]._M_elems[2]);
  (this->interpolationInterval).m_data[lVar2 + -1] = pVar3.first;
  *(double *)(&this->interpolationInterval)[lVar2].m_data = pVar3.second;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::setupEdgesInterpolation(
    Qt::Orientation orientation)
{
    Q_Q(QGraphicsAnchorLayout);

    qreal current;
    current = (orientation == Qt::Horizontal) ? q->contentsRect().width() : q->contentsRect().height();

    std::pair<Interval, qreal> result;
    result = getFactor(current,
                       sizeHints[orientation][Qt::MinimumSize],
                       sizeHints[orientation][Qt::PreferredSize],
                       sizeHints[orientation][Qt::PreferredSize],
                       sizeHints[orientation][Qt::PreferredSize],
                       sizeHints[orientation][Qt::MaximumSize]);

    interpolationInterval[orientation] = result.first;
    interpolationProgress[orientation] = result.second;
}